

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O3

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar3 = bottom_top_blob->c;
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  if (this->slope == 0.0) {
    if (0 < (int)uVar3) {
      sVar4 = bottom_top_blob->cstep;
      sVar5 = bottom_top_blob->elemsize;
      pvVar7 = bottom_top_blob->data;
      uVar8 = 0;
      do {
        if (0 < (int)uVar6) {
          uVar9 = 0;
          do {
            pfVar1 = (float *)((long)pvVar7 + uVar9 * 4);
            if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
              *(undefined4 *)((long)pvVar7 + uVar9 * 4) = 0;
            }
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        uVar8 = uVar8 + 1;
        pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar5);
      } while (uVar8 != uVar3);
    }
  }
  else if (0 < (int)uVar3) {
    sVar4 = bottom_top_blob->cstep;
    sVar5 = bottom_top_blob->elemsize;
    pvVar7 = bottom_top_blob->data;
    uVar8 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar9 = 0;
        do {
          fVar2 = *(float *)((long)pvVar7 + uVar9 * 4);
          if (fVar2 < 0.0) {
            *(float *)((long)pvVar7 + uVar9 * 4) = fVar2 * this->slope;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      uVar8 = uVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar5);
    } while (uVar8 != uVar3);
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}